

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O2

lws_spa * lws_spa_create_via_info(lws *wsi,lws_spa_create_info_t *i)

{
  byte bVar1;
  lws_spa_fileupload_cb p_Var2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  lws_spa *spa;
  char *pcVar6;
  char **ppcVar7;
  lws_urldecode_stateful *plVar8;
  int *piVar9;
  long lVar10;
  size_t sVar11;
  lwsac **pplVar12;
  char acStack_108 [216];
  
  if (i->ac == (lwsac **)0x0) {
    spa = (lws_spa *)lws_zalloc(0x68,"spa");
  }
  else {
    spa = (lws_spa *)lwsac_use_zero(i->ac,0x68,i->ac_chunk_size);
  }
  if (spa == (lws_spa *)0x0) {
    return (lws_spa *)0x0;
  }
  iVar5 = i->count_params;
  iVar4 = i->max_storage;
  p_Var2 = i->opt_cb;
  pvVar3 = i->opt_data;
  sVar11 = i->param_names_stride;
  pplVar12 = i->ac;
  (spa->i).param_names = i->param_names;
  (spa->i).count_params = iVar5;
  (spa->i).max_storage = iVar4;
  (spa->i).ac_chunk_size = i->ac_chunk_size;
  (spa->i).param_names_stride = sVar11;
  (spa->i).ac = pplVar12;
  (spa->i).opt_cb = p_Var2;
  (spa->i).opt_data = pvVar3;
  iVar5 = (spa->i).max_storage;
  if (iVar5 == 0) {
    (spa->i).max_storage = 0x200;
    iVar5 = 0x200;
  }
  if (i->ac == (lwsac **)0x0) {
    pcVar6 = (char *)lws_realloc((void *)0x0,(long)iVar5,"spa");
  }
  else {
    pcVar6 = (char *)lwsac_use(i->ac,(long)iVar5,i->ac_chunk_size);
  }
  spa->storage = pcVar6;
  if (pcVar6 != (char *)0x0) {
    iVar5 = i->max_storage;
    spa->end = pcVar6 + (long)iVar5 + -1;
    if ((long)i->count_params == 0) {
LAB_00134ed2:
      pplVar12 = (spa->i).ac;
      if (pplVar12 == (lwsac **)0x0) {
        plVar8 = (lws_urldecode_stateful *)lws_zalloc(0x240,"stateful urldecode");
      }
      else {
        plVar8 = (lws_urldecode_stateful *)lwsac_use_zero(pplVar12,0x240,(spa->i).ac_chunk_size);
      }
      if (plVar8 == (lws_urldecode_stateful *)0x0) {
        spa->s = (lws_urldecode_stateful *)0x0;
      }
      else {
        plVar8->out = pcVar6;
        plVar8->out_len = iVar5;
        plVar8->output = lws_urldecode_spa_cb;
        plVar8->pos = 0;
        plVar8->mp = 0;
        plVar8->sum = 0;
        plVar8->state = US_NAME;
        plVar8->name[0] = '\0';
        plVar8->data = spa;
        plVar8->wsi = wsi;
        iVar5 = lws_hdr_copy(wsi,acStack_108,0xcd,WSI_TOKEN_HTTP_CONTENT_TYPE);
        if ((0 < iVar5) &&
           ((iVar5 = bcmp(acStack_108,"multipart/form-data",0x13), iVar5 == 0 ||
            (iVar5 = bcmp(acStack_108,"multipart/related",0x11), iVar5 == 0)))) {
          plVar8->field_0x22c = plVar8->field_0x22c | 1;
          plVar8->state = MT_LOOK_BOUND_IN;
          plVar8->mp = 2;
          pcVar6 = strstr(acStack_108,"boundary=");
          if (pcVar6 != (char *)0x0) {
            builtin_strncpy(plVar8->mime_boundary,"\r\n--",4);
            for (lVar10 = 0; lVar10 != 0x7b; lVar10 = lVar10 + 1) {
              bVar1 = pcVar6[lVar10 + 9];
              if (((ulong)bVar1 < 0x3c) && ((0x800000100000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
              break;
              plVar8->mime_boundary[lVar10 + 4] = bVar1;
            }
            plVar8->mime_boundary[lVar10 + 4] = '\0';
            _lws_log(4,"boundary \'%s\'\n",plVar8->mime_boundary);
          }
        }
        spa->s = plVar8;
        if ((long)i->count_params == 0) {
LAB_00135074:
          _lws_log(4,"%s: Created SPA %p\n","lws_spa_create_via_info",spa);
          return spa;
        }
        sVar11 = (long)i->count_params << 2;
        if (i->ac == (lwsac **)0x0) {
          piVar9 = (int *)lws_zalloc(sVar11,"spa param len");
        }
        else {
          piVar9 = (int *)lwsac_use_zero(i->ac,sVar11,i->ac_chunk_size);
        }
        spa->param_length = piVar9;
        if (piVar9 != (int *)0x0) goto LAB_00135074;
        lws_urldecode_s_destroy(spa,spa->s);
      }
      pplVar12 = i->ac;
      if (pplVar12 != (lwsac **)0x0) goto LAB_001350fa;
      lws_realloc(spa->params,0,"lws_free");
    }
    else {
      sVar11 = (long)i->count_params << 3;
      if (i->ac == (lwsac **)0x0) {
        ppcVar7 = (char **)lws_zalloc(sVar11,"spa params");
      }
      else {
        ppcVar7 = (char **)lwsac_use_zero(i->ac,sVar11,i->ac_chunk_size);
      }
      spa->params = ppcVar7;
      if (ppcVar7 != (char **)0x0) {
        pcVar6 = spa->storage;
        iVar5 = i->max_storage;
        goto LAB_00134ed2;
      }
    }
    pplVar12 = i->ac;
    if (pplVar12 != (lwsac **)0x0) goto LAB_001350fa;
    lws_realloc(spa->storage,0,"lws_free");
  }
  pplVar12 = i->ac;
  if (pplVar12 == (lwsac **)0x0) {
    lws_realloc(spa,0,"lws_free");
    pplVar12 = i->ac;
    if (pplVar12 == (lwsac **)0x0) {
      return (lws_spa *)0x0;
    }
  }
LAB_001350fa:
  lwsac_free(pplVar12);
  return (lws_spa *)0x0;
}

Assistant:

struct lws_spa *
lws_spa_create_via_info(struct lws *wsi, const lws_spa_create_info_t *i)
{
	struct lws_spa *spa;

	if (i->ac)
		spa = lwsac_use_zero(i->ac, sizeof(*spa), i->ac_chunk_size);
	else
		spa = lws_zalloc(sizeof(*spa), "spa");

	if (!spa)
		return NULL;

	spa->i = *i;
	if (!spa->i.max_storage)
		spa->i.max_storage = 512;

	if (i->ac)
		spa->storage = lwsac_use(i->ac, spa->i.max_storage,
					 i->ac_chunk_size);
	else
		spa->storage = lws_malloc(spa->i.max_storage, "spa");

	if (!spa->storage)
		goto bail2;

	spa->end = spa->storage + i->max_storage - 1;

	if (i->count_params) {
		if (i->ac)
			spa->params = lwsac_use_zero(i->ac,
				sizeof(char *) * i->count_params, i->ac_chunk_size);
		else
			spa->params = lws_zalloc(sizeof(char *) * i->count_params,
					 "spa params");
		if (!spa->params)
			goto bail3;
	}

	spa->s = lws_urldecode_s_create(spa, wsi, spa->storage, i->max_storage,
					lws_urldecode_spa_cb);
	if (!spa->s)
		goto bail4;

	if (i->count_params) {
		if (i->ac)
			spa->param_length = lwsac_use_zero(i->ac,
				sizeof(int) * i->count_params, i->ac_chunk_size);
		else
			spa->param_length = lws_zalloc(sizeof(int) * i->count_params,
						"spa param len");
		if (!spa->param_length)
			goto bail5;
	}

	lwsl_notice("%s: Created SPA %p\n", __func__, spa);

	return spa;

bail5:
	lws_urldecode_s_destroy(spa, spa->s);
bail4:
	if (!i->ac)
		lws_free(spa->params);
bail3:
	if (!i->ac)
		lws_free(spa->storage);
bail2:
	if (!i->ac)
		lws_free(spa);

	if (i->ac)
		lwsac_free(i->ac);

	return NULL;
}